

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::addSatUI8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  byte bVar1;
  
  if (((this->type).id == 2) && ((other->type).id == 2)) {
    bVar1 = 0xff;
    if (!CARRY1((this->field_0).v128[0],(other->field_0).v128[0])) {
      bVar1 = (this->field_0).v128[0] + (other->field_0).v128[0];
    }
    *(uint *)&__return_storage_ptr__->field_0 = (uint)bVar1;
    (__return_storage_ptr__->type).id = 2;
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x120,"int32_t wasm::Literal::geti32() const");
}

Assistant:

Literal Literal::addSatUI8(const Literal& other) const {
  return Literal(add_sat_u<uint8_t>(geti32(), other.geti32()));
}